

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

bool CompressedXipReader::isCompressedXip(ReadWriter_ptr *rd,uint64_t ofs)

{
  element_type *peVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  char *pcVar5;
  bool bVar6;
  
  peVar1 = (rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_ReadWriter[4])(peVar1,ofs + 0x34);
  uVar2 = ReadWriter::read32le
                    ((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  uVar3 = ReadWriter::read32le
                    ((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (uVar2 < uVar3 * 2 + 0x44) {
    if (1 < g_verbose) {
      pcVar5 = "not cxip: nb(=0x%x)*x+0x44 > do(0x%x)\n";
      uVar4 = uVar3;
LAB_0011039c:
      printf(pcVar5,(ulong)uVar4,(ulong)uVar2);
      return false;
    }
  }
  else {
    uVar4 = ReadWriter::read32le
                      ((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    if ((uVar4 & uVar4 - 1) == 0) {
      if ((ulong)uVar3 * (ulong)uVar4 < 0x40000001) {
        uVar4 = ReadWriter::read32le
                          ((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
        bVar6 = uVar4 == 0x58505253;
        if (bVar6) {
          return bVar6;
        }
        if (g_verbose < 2) {
          return bVar6;
        }
        pcVar5 = "not cxip: mg(0x%x)\n";
LAB_00110422:
        printf(pcVar5,(ulong)uVar4);
        return false;
      }
      if (1 < g_verbose) {
        pcVar5 = "not cxip: fb(0x%x)*nb(0x%x) > 0x40000000\n";
        uVar2 = uVar3;
        goto LAB_0011039c;
      }
    }
    else if (1 < g_verbose) {
      pcVar5 = "not cxip: fb(0x%x)\n";
      goto LAB_00110422;
    }
  }
  return false;
}

Assistant:

static bool isCompressedXip(ReadWriter_ptr rd, uint64_t ofs)
    {
        rd->setpos(ofs+0x34);
        uint32_t dataofs= rd->read32le();
        uint32_t nblocks= rd->read32le();
        //printf("d=%08x, n=%08x\n", dataofs, nblocks);
        if (nblocks*2+0x44>dataofs) {
            if (g_verbose > 1)
                printf("not cxip: nb(=0x%x)*x+0x44 > do(0x%x)\n", nblocks, dataofs);
            return false;
        }
        uint32_t fullblocksize= rd->read32le();
        //printf("bs=%08x\n", fullblocksize);
        if (fullblocksize & (fullblocksize-1)) {
            if (g_verbose > 1)
                printf("not cxip: fb(0x%x)\n", fullblocksize);
            return false;
        }
        if (uint64_t(fullblocksize)*nblocks > 0x40000000) {
            if (g_verbose > 1)
                printf("not cxip: fb(0x%x)*nb(0x%x) > 0x40000000\n", fullblocksize, nblocks );
            return false;
        }
        uint32_t magic= rd->read32le();
        //printf("mg=%08x\n", magic);
        if (magic!=0x58505253)  {
            if (g_verbose > 1)
                printf("not cxip: mg(0x%x)\n", magic);
            return false;
        }

        return true;
    }